

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O1

void __thiscall TextReader::parse_bin(TextReader *this)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  pointer pcVar4;
  size_t sVar5;
  ulong uVar6;
  _Alloc_hider _Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  bool bVar9;
  string local_58;
  string local_38;
  
  sVar2 = this->current_token_len_;
  sVar5 = sVar2 + 2;
  uVar3 = (this->current_line_)._M_string_length;
  this->current_token_len_ = sVar5;
  uVar6 = sVar2 + this->current_token_pos_ + 2;
  bVar9 = uVar6 < uVar3;
  if (bVar9) {
    pcVar4 = (this->current_line_)._M_dataplus._M_p;
    do {
      if ((pcVar4[uVar6] & 0xfeU) != 0x30) {
        if ((bVar9) &&
           ((cVar1 = (this->current_line_)._M_dataplus._M_p[uVar6],
            (byte)(cVar1 + 0xbfU) < 0x1a || (byte)(cVar1 - 0x30U) < 10 ||
            (cVar1 == '_' || (byte)(cVar1 + 0x9fU) < 0x1a)))) {
          paVar8 = &local_38.field_2;
          local_38._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,"Invalid symbol in binary value","");
          parse_error(this,&local_38);
          _Var7._M_p = local_38._M_dataplus._M_p;
          goto LAB_0010b7e6;
        }
        break;
      }
      uVar6 = this->current_token_pos_ + sVar5 + 1;
      sVar5 = sVar5 + 1;
      this->current_token_len_ = sVar5;
      bVar9 = uVar6 < uVar3;
    } while (bVar9);
  }
  if (sVar5 == 2) {
    paVar8 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"Binary value prefix specified without the value","");
    parse_error(this,&local_58);
    _Var7._M_p = local_58._M_dataplus._M_p;
LAB_0010b7e6:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var7._M_p != paVar8) {
      operator_delete(_Var7._M_p);
    }
  }
  return;
}

Assistant:

inline void parse_bin() {
        current_token_len_++;
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
               _is_bin_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            _is_literal_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            parse_error(ERROR_BIN_INVALID_SYMBOL);
        } else if (current_token_len_ == 2) {
            parse_error(ERROR_MISSING_BIN_VALUE);
        };
    }